

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

void ncnn::dynamic_quantize_2d(Mat *blob,Mat *blob_int8,float *scale,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,(Allocator *)opt);
  iVar7 = blob_int8->h;
  uVar6 = (ulong)iVar7;
  if ((long)uVar6 < 1) {
    *scale = 1.0;
  }
  else {
    pvVar8 = blob->data;
    fVar13 = 0.0;
    uVar9 = 0;
    do {
      if (0 < blob_int8->w) {
        uVar10 = 0;
        do {
          fVar14 = ABS(*(float *)((long)pvVar8 + uVar10 * 4));
          if (fVar13 <= fVar14) {
            fVar13 = fVar14;
          }
          uVar10 = uVar10 + 1;
        } while ((uint)blob_int8->w != uVar10);
      }
      uVar9 = uVar9 + 1;
      pvVar8 = (void *)((long)pvVar8 + (long)blob->w * blob->elemsize);
    } while (uVar9 != uVar6);
    *scale = (float)(-(uint)(fVar13 == 0.0) & 0x3f800000 |
                    ~-(uint)(fVar13 == 0.0) & (uint)(127.0 / fVar13));
    if (0 < iVar7) {
      uVar9 = (ulong)(uint)blob_int8->w;
      lVar11 = 0;
      do {
        iVar7 = (int)uVar9;
        if (0 < iVar7) {
          iVar1 = blob->w;
          sVar2 = blob_int8->elemsize;
          pvVar8 = blob_int8->data;
          sVar3 = blob->elemsize;
          pvVar4 = blob->data;
          lVar12 = 0;
          do {
            fVar13 = roundf(*scale * *(float *)((long)pvVar4 +
                                               lVar12 * 4 + sVar3 * lVar11 * (long)iVar1));
            iVar5 = (int)fVar13;
            if (iVar5 < -0x7e) {
              iVar5 = -0x7f;
            }
            if (0x7e < iVar5) {
              iVar5 = 0x7f;
            }
            *(char *)((long)pvVar8 + lVar12 + sVar2 * lVar11 * (long)iVar7) = (char)iVar5;
            lVar12 = lVar12 + 1;
            uVar9 = (ulong)blob_int8->w;
          } while (lVar12 < (long)uVar9);
          uVar6 = (ulong)(uint)blob_int8->h;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)uVar6);
    }
  }
  return;
}

Assistant:

static void dynamic_quantize_2d(const Mat& blob, Mat& blob_int8, float& scale, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);

    float absmax = 0.f;
    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }
    }

    scale = absmax == 0.f ? 1.f : 127.f / absmax;

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}